

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

ModuleImpl * __thiscall
capnp::SchemaParser::getModuleImpl(SchemaParser *this,Own<capnp::SchemaFile> *file)

{
  __node_base *p_Var1;
  size_type *psVar2;
  Impl *this_00;
  SchemaFile *pSVar3;
  _Hash_node_base *p_Var4;
  __buckets_ptr pp_Var5;
  undefined8 *puVar6;
  long lVar7;
  ModuleImpl *pMVar8;
  Disposer *pDVar9;
  char cVar10;
  int iVar11;
  __node_ptr p_Var12;
  undefined4 extraout_var;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var13;
  undefined8 *puVar14;
  __node_base_ptr p_Var15;
  ulong uVar16;
  size_type __n;
  ulong uVar17;
  _Hash_node_base _Var18;
  _Hash_node_base *p_Var19;
  __node_base_ptr p_Var20;
  __node_ptr p_Var21;
  __node_ptr p_Var22;
  undefined1 auVar23 [16];
  __buckets_alloc_type __alloc;
  Locked<std::unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>_>
  lock;
  new_allocator<std::__detail::_Hash_node_base_*> local_71;
  _Scoped_node local_70;
  size_t local_60;
  Own<capnp::SchemaFile> *local_58;
  SchemaParser *local_50;
  unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>
  *local_48;
  Impl *local_40;
  unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>
  *local_38;
  
  this_00 = (this->impl).ptr;
  kj::_::Mutex::lock((Mutex *)this_00,EXCLUSIVE);
  local_70._M_h = (__hashtable_alloc *)&(this_00->fileMap).value;
  pSVar3 = file->ptr;
  local_48 = (unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>
              *)local_70._M_h;
  local_40 = this_00;
  local_38 = (unordered_map<const_capnp::SchemaFile_*,_kj::Own<capnp::SchemaParser::ModuleImpl>,_capnp::(anonymous_namespace)::SchemaFileHash,_capnp::(anonymous_namespace)::SchemaFileEq,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>_>
              *)local_70._M_h;
  p_Var12 = (__node_ptr)operator_new(0x28);
  (p_Var12->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  *(SchemaFile **)
   &(p_Var12->
    super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
    ).
    super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
    ._M_storage._M_storage = pSVar3;
  *(undefined8 *)
   ((long)&(p_Var12->
           super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
           ._M_storage._M_storage + 8) = 0;
  *(undefined8 *)
   ((long)&(p_Var12->
           super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
           ._M_storage._M_storage + 0x10) = 0;
  local_70._M_node = p_Var12;
  local_58 = file;
  local_50 = this;
  iVar11 = (*pSVar3->_vptr_SchemaFile[5])(pSVar3);
  p_Var19 = (_Hash_node_base *)(ulong)(CONCAT44(extraout_var,iVar11) != 0);
  p_Var15 = (__node_base_ptr)0x0;
  uVar16 = (ulong)p_Var19 % (this_00->fileMap).value._M_h._M_bucket_count;
  p_Var20 = (this_00->fileMap).value._M_h._M_buckets[uVar16 & 0xffffffff];
  if (p_Var20 != (__node_base_ptr)0x0) {
    p_Var4 = p_Var20->_M_nxt;
    do {
      p_Var15 = p_Var20;
      p_Var20 = p_Var4;
      if ((p_Var20[4]._M_nxt == p_Var19) &&
         (cVar10 = (**(code **)(**(long **)&(p_Var12->
                                            super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
                                            ._M_storage._M_storage + 0x18))(), cVar10 != '\0'))
      break;
      p_Var4 = p_Var20->_M_nxt;
      if (p_Var4 == (_Hash_node_base *)0x0) {
        p_Var15 = (__node_base_ptr)0x0;
        break;
      }
      p_Var15 = (__node_base_ptr)0x0;
    } while ((ulong)p_Var4[4]._M_nxt % (this_00->fileMap).value._M_h._M_bucket_count == uVar16);
  }
  if (p_Var15 == (__node_base_ptr)0x0) {
    p_Var22 = (__node_ptr)0x0;
  }
  else {
    p_Var22 = (__node_ptr)p_Var15->_M_nxt;
  }
  p_Var21 = p_Var22;
  if (p_Var22 == (__node_ptr)0x0) {
    local_60 = (this_00->fileMap).value._M_h._M_rehash_policy._M_next_resize;
    auVar23 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this_00->fileMap).value._M_h._M_rehash_policy,
                         (this_00->fileMap).value._M_h._M_bucket_count,
                         (this_00->fileMap).value._M_h._M_element_count);
    __n = auVar23._8_8_;
    if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(this_00->fileMap).value._M_h._M_single_bucket;
        (this_00->fileMap).value._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (&local_71,__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      _Var18._M_nxt = (this_00->fileMap).value._M_h._M_before_begin._M_nxt;
      (this_00->fileMap).value._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var18._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(this_00->fileMap).value._M_h._M_before_begin;
        uVar16 = 0;
        do {
          p_Var4 = (_Var18._M_nxt)->_M_nxt;
          uVar17 = (ulong)_Var18._M_nxt[4]._M_nxt % __n;
          if (__s[uVar17] == (_Hash_node_base *)0x0) {
            (_Var18._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var18._M_nxt;
            __s[uVar17] = p_Var1;
            if ((_Var18._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var13 = __s + uVar16;
              goto LAB_0042693d;
            }
          }
          else {
            (_Var18._M_nxt)->_M_nxt = __s[uVar17]->_M_nxt;
            pp_Var13 = &__s[uVar17]->_M_nxt;
            uVar17 = uVar16;
LAB_0042693d:
            *pp_Var13 = _Var18._M_nxt;
          }
          _Var18._M_nxt = p_Var4;
          uVar16 = uVar17;
        } while (p_Var4 != (_Hash_node_base *)0x0);
      }
      pp_Var5 = (this_00->fileMap).value._M_h._M_buckets;
      if (&(this_00->fileMap).value._M_h._M_single_bucket != pp_Var5) {
        operator_delete(pp_Var5,(this_00->fileMap).value._M_h._M_bucket_count << 3);
      }
      (this_00->fileMap).value._M_h._M_bucket_count = __n;
      (this_00->fileMap).value._M_h._M_buckets = __s;
      uVar16 = (ulong)p_Var19 % __n;
    }
    (p_Var12->
    super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
    ).super__Hash_node_code_cache<true>._M_hash_code = (size_t)p_Var19;
    pp_Var5 = (local_48->_M_h)._M_buckets;
    if (pp_Var5[uVar16] == (__node_base_ptr)0x0) {
      p_Var19 = (this_00->fileMap).value._M_h._M_before_begin._M_nxt;
      (p_Var12->super__Hash_node_base)._M_nxt = p_Var19;
      (this_00->fileMap).value._M_h._M_before_begin._M_nxt = (_Hash_node_base *)p_Var12;
      if (p_Var19 != (_Hash_node_base *)0x0) {
        pp_Var5[(ulong)p_Var19[4]._M_nxt % (this_00->fileMap).value._M_h._M_bucket_count] =
             (__node_base_ptr)p_Var12;
      }
      (local_48->_M_h)._M_buckets[uVar16] = &(this_00->fileMap).value._M_h._M_before_begin;
    }
    else {
      (p_Var12->super__Hash_node_base)._M_nxt = pp_Var5[uVar16]->_M_nxt;
      pp_Var5[uVar16]->_M_nxt = (_Hash_node_base *)p_Var12;
    }
    psVar2 = &(this_00->fileMap).value._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    local_70._M_node = (__node_ptr)0x0;
    p_Var21 = p_Var12;
  }
  std::
  _Hashtable<const_capnp::SchemaFile_*,_std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_std::allocator<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>,_std::__detail::_Select1st,_capnp::(anonymous_namespace)::SchemaFileEq,_capnp::(anonymous_namespace)::SchemaFileHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_70);
  if (p_Var22 == (__node_ptr)0x0) {
    puVar14 = (undefined8 *)operator_new(0x58);
    pDVar9 = local_58->disposer;
    pSVar3 = local_58->ptr;
    local_58->ptr = (SchemaFile *)0x0;
    *puVar14 = &PTR_addError_0064ab78;
    puVar14[1] = local_50;
    puVar14[2] = pDVar9;
    puVar14[3] = pSVar3;
    *(undefined4 *)(puVar14 + 4) = 0;
    puVar14[9] = 0;
    puVar14[10] = 0;
    puVar6 = *(undefined8 **)
              ((long)&(p_Var21->
                      super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
                      ._M_storage._M_storage + 8);
    lVar7 = *(long *)((long)&(p_Var21->
                             super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
                             ).
                             super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
                             ._M_storage._M_storage + 0x10);
    *(undefined8 **)
     ((long)&(p_Var21->
             super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
             ._M_storage._M_storage + 8) =
         &kj::_::HeapDisposer<capnp::SchemaParser::ModuleImpl>::instance;
    *(undefined8 **)
     ((long)&(p_Var21->
             super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
             ).
             super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
             ._M_storage._M_storage + 0x10) = puVar14;
    if (lVar7 != 0) {
      (**(code **)*puVar6)();
    }
  }
  pMVar8 = *(ModuleImpl **)
            ((long)&(p_Var21->
                    super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
                    ._M_storage._M_storage + 0x10);
  kj::_::Mutex::unlock((Mutex *)this_00,EXCLUSIVE);
  return pMVar8;
}

Assistant:

SchemaParser::ModuleImpl& SchemaParser::getModuleImpl(kj::Own<SchemaFile>&& file) const {
  auto lock = impl->fileMap.lockExclusive();

  auto insertResult = lock->insert(std::make_pair(file.get(), kj::Own<ModuleImpl>()));
  if (insertResult.second) {
    // This is a newly-inserted entry.  Construct the ModuleImpl.
    insertResult.first->second = kj::heap<ModuleImpl>(*this, kj::mv(file));
  }
  return *insertResult.first->second;
}